

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translation.h
# Opt level: O0

bilingual_str *
tinyformat::format<char[10],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (bilingual_str *fmt,char (*args) [10],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3)

{
  long lVar1;
  char (*args_00) [10];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fmt_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  bilingual_str *in_RDI;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 translate_arg;
  undefined1 in_stack_ffffffffffffff2f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff38;
  bilingual_str *args_3_00;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 uVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  args_3_00 = in_RDI;
  args_00 = format<char[10],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>(bilingual_str_const&,char_const(&)[10],std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
            ::{lambda(auto:1_const&,bool)#1}::operator()
                      (in_stack_ffffffffffffff38,(char (*) [10])in_stack_ffffffffffffff30,
                       (bool)in_stack_ffffffffffffff2f);
  fmt_00 = format<char[10],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>(bilingual_str_const&,char_const(&)[10],std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
           ::{lambda(auto:1_const&,bool)#1}::operator()
                     (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                      (bool)in_stack_ffffffffffffff2f);
  format<char[10],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>(bilingual_str_const&,char_const(&)[10],std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
  ::{lambda(auto:1_const&,bool)#1}::operator()
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f);
  format<char[10],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>(bilingual_str_const&,char_const(&)[10],std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
  ::{lambda(auto:1_const&,bool)#1}::operator()
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f);
  format<char[10],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (fmt_00,args_00,in_RSI,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(uVar2,in_stack_ffffffffffffff60),&args_3_00->original);
  format<char[10],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>(bilingual_str_const&,char_const(&)[10],std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
  ::{lambda(auto:1_const&,bool)#1}::operator()
            (in_stack_ffffffffffffff38,(char (*) [10])in_stack_ffffffffffffff30,
             (bool)in_stack_ffffffffffffff2f);
  format<char[10],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>(bilingual_str_const&,char_const(&)[10],std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
  ::{lambda(auto:1_const&,bool)#1}::operator()
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f);
  format<char[10],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>(bilingual_str_const&,char_const(&)[10],std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
  ::{lambda(auto:1_const&,bool)#1}::operator()
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f);
  format<char[10],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>(bilingual_str_const&,char_const(&)[10],std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
  ::{lambda(auto:1_const&,bool)#1}::operator()
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f);
  format<char[10],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (fmt_00,args_00,in_RSI,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(uVar2,in_stack_ffffffffffffff60),&args_3_00->original);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

bilingual_str format(const bilingual_str& fmt, const Args&... args)
{
    const auto translate_arg{[](const auto& arg, bool translated) -> const auto& {
        if constexpr (std::is_same_v<decltype(arg), const bilingual_str&>) {
            return translated ? arg.translated : arg.original;
        } else {
            return arg;
        }
    }};
    return bilingual_str{tfm::format(fmt.original, translate_arg(args, false)...),
                         tfm::format(fmt.translated, translate_arg(args, true)...)};
}